

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

LY_ERR lysp_resolve_ext_instance_records(lysp_ctx *pctx)

{
  lysc_node *__s;
  LY_ERR LVar1;
  int iVar2;
  uint uVar3;
  lysp_ext_instance *plVar4;
  lyplg_ext_record *plVar5;
  size_t sVar6;
  char *pcVar7;
  void *pvVar8;
  ulong uVar9;
  long lVar10;
  lysp_ext_instance *plVar11;
  lyd_node *plVar12;
  ly_ctx *plVar13;
  lysp_ext_instance *plVar14;
  char *pcVar15;
  lyd_node *plVar16;
  lyd_meta *plVar17;
  int iVar18;
  lyd_node **ext_def;
  lysp_ext_instance *plVar19;
  undefined8 *puVar20;
  byte bVar21;
  lys_module *mod;
  char *local_80;
  lyd_node *local_78;
  ulong local_70;
  void *local_68;
  lysp_ext_instance *local_60;
  lys_module *local_58;
  lysf_ctx local_50;
  
  bVar21 = 0;
  local_50.mod = (lys_module *)0x0;
  local_50.ext_set.size = 0;
  local_50.ext_set.count = 0;
  local_50.ext_set.field_2.dnodes = (lyd_node **)0x0;
  if (pctx == (lysp_ctx *)0x0) {
    local_50.ctx = (ly_ctx *)0x0;
  }
  else {
    local_50.ctx = (ly_ctx *)
                   **(undefined8 **)
                     (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
  }
  if ((pctx->ext_inst).count != 0) {
    uVar9 = 0;
    do {
      plVar11 = (lysp_ext_instance *)(pctx->ext_inst).field_2.dnodes[uVar9];
      plVar19 = (lysp_ext_instance *)0x0;
      plVar14 = plVar11;
      while( true ) {
        if (plVar11 == (lysp_ext_instance *)0x0) {
          plVar4 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar4 = plVar11[-1].exts;
        }
        if (plVar4 <= plVar19) break;
        if (pctx == (lysp_ctx *)0x0) {
          LVar1 = lysp_ext_find_definition((ly_ctx *)0x0,plVar14,&local_58,&plVar14->def);
          if (LVar1 != LY_SUCCESS) {
            return LVar1;
          }
          ext_def = (lyd_node **)&plVar11[(long)plVar19].def;
          plVar13 = (ly_ctx *)0x0;
        }
        else {
          ext_def = (lyd_node **)&plVar14->def;
          LVar1 = lysp_ext_find_definition
                            ((ly_ctx *)
                             **(undefined8 **)
                               (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1],
                             plVar14,&local_58,(lysp_ext **)ext_def);
          if (LVar1 != LY_SUCCESS) {
            return LVar1;
          }
          plVar13 = (ly_ctx *)
                    **(undefined8 **)
                      (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
        }
        LVar1 = lysp_ext_instance_resolve_argument(plVar13,plVar14);
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
        plVar5 = lyplg_ext_record_find
                           (local_58->ctx,local_58->name,local_58->revision,*(char **)*ext_def);
        plVar14->record = plVar5;
        plVar19 = (lysp_ext_instance *)((long)&plVar19->name + 1);
        plVar14 = plVar14 + 1;
      }
      uVar9 = uVar9 + 1;
      uVar3 = (pctx->ext_inst).count;
    } while (uVar9 < uVar3);
    if (uVar3 != 0) {
      uVar9 = 0;
      do {
        plVar16 = (pctx->ext_inst).field_2.dnodes[uVar9];
        local_68 = (void *)0x0;
        local_78 = plVar16;
        local_70 = uVar9;
LAB_0015a2e4:
        plVar11 = (lysp_ext_instance *)(plVar16 + (long)local_68 * 2);
        local_60 = plVar11;
        while( true ) {
          if (plVar16 == (lyd_node *)0x0) {
            pvVar8 = (void *)0x0;
          }
          else {
            pvVar8 = plVar16[-1].priv;
          }
          if (pvVar8 <= local_68) break;
          if ((plVar11->record == (lyplg_ext_record *)0x0) ||
             ((plVar11->record->plugin).parse == (lyplg_ext_parse_clb)0x0)) goto LAB_0015a5c4;
          if (*(short *)&plVar11->parent_stmt != 0) {
            plVar17 = (lyd_meta *)plVar11->parent;
            plVar16 = (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
            local_80 = (char *)0x0;
            if (plVar17 == (lyd_meta *)0x0) {
LAB_0015a3f4:
              pcVar7 = strdup("/");
LAB_0015a3ff:
              if (pcVar7 != (char *)0x0) {
                sVar6 = strlen(pcVar7);
                iVar2 = (int)sVar6;
                pcVar7 = (char *)realloc(pcVar7,(ulong)(iVar2 + 2));
                if (pcVar7 != (char *)0x0) {
                  iVar18 = iVar2 + 1;
                  (pcVar7 + (sVar6 & 0xffffffff))[0] = '/';
                  (pcVar7 + (sVar6 & 0xffffffff))[1] = '\0';
                  uVar3 = iVar2 + 1;
                  goto LAB_0015a490;
                }
              }
            }
            else {
              do {
                pcVar7 = local_80;
                if (plVar17->parent == (lyd_node *)0x0) {
                  pcVar15 = local_80;
                  if (local_80 == (char *)0x0) {
                    pcVar15 = "";
                  }
                  iVar2 = asprintf(&local_80,"%s%s:%s%s","/",*(undefined8 *)(*(long *)plVar16 + 8),
                                   plVar17->name,pcVar15);
                }
                else {
                  pcVar15 = local_80;
                  if (local_80 == (char *)0x0) {
                    pcVar15 = "";
                  }
                  iVar2 = asprintf(&local_80,"%s%s%s","/",plVar17->name,pcVar15);
                }
                free(pcVar7);
                plVar17 = (lyd_meta *)plVar17->parent;
              } while ((plVar17 != (lyd_meta *)0x0) && (-1 < iVar2));
              if (-1 < iVar2) {
                plVar11 = local_60;
                pcVar7 = local_80;
                if (iVar2 == 0) goto LAB_0015a3f4;
                goto LAB_0015a3ff;
              }
              free(local_80);
            }
LAB_0015a604:
            if (pctx == (lysp_ctx *)0x0) {
              plVar13 = (ly_ctx *)0x0;
              goto LAB_0015a624;
            }
            puVar20 = *(undefined8 **)
                       (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
LAB_0015a61d:
            plVar13 = (ly_ctx *)*puVar20;
LAB_0015a624:
            ly_log(plVar13,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "lysp_resolve_ext_instance_log_path");
            return LY_EMEM;
          }
          puVar20 = *(undefined8 **)
                     (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
          pcVar15 = (char *)puVar20[1];
          sVar6 = strlen(pcVar15);
          pcVar7 = (char *)malloc((ulong)((int)sVar6 + 3));
          if (pcVar7 == (char *)0x0) goto LAB_0015a61d;
          iVar18 = (int)sVar6 + 2;
          uVar3 = sprintf(pcVar7,"/%s:",pcVar15);
LAB_0015a490:
          pcVar15 = plVar11->name;
          sVar6 = strlen(pcVar15);
          iVar18 = (int)sVar6 + iVar18;
          pcVar7 = (char *)realloc(pcVar7,(ulong)(iVar18 + 0xf));
          if (pcVar7 == (char *)0x0) goto LAB_0015a604;
          iVar2 = sprintf(pcVar7 + uVar3,"{extension=\'%s\'}",pcVar15);
          __s = (lysc_node *)plVar11->argument;
          if (__s != (lysc_node *)0x0) {
            sVar6 = strlen((char *)__s);
            pcVar7 = (char *)realloc(pcVar7,(ulong)(iVar18 + (int)sVar6 + 0x10));
            if (pcVar7 == (char *)0x0) goto LAB_0015a604;
            sprintf(pcVar7 + (iVar2 + uVar3),"/%s",__s);
          }
          ly_log_location((lysc_node *)0x0,(lyd_node *)0x0,pcVar7,(ly_in *)0x0);
          plVar11 = local_60;
          LVar1 = (*(local_60->record->plugin).parse)(pctx,local_60);
          ly_log_location_revert(0,0,1,0);
          free(pcVar7);
          if (LVar1 != LY_ENOT) goto LAB_0015a5b0;
          lysp_ext_instance_free(&local_50,plVar11);
          pvVar8 = (void *)((long)local_78[-1].priv - 1);
          local_78[-1].priv = pvVar8;
          uVar9 = local_70;
          plVar16 = local_78;
          if (local_68 < pvVar8) {
            plVar12 = local_78 + (long)pvVar8 * 2;
            plVar14 = plVar11;
            for (lVar10 = 0xe; lVar10 != 0; lVar10 = lVar10 + -1) {
              plVar14->name = *(char **)plVar12;
              plVar12 = (lyd_node *)((long)plVar12 + (ulong)bVar21 * -0x10 + 8);
              plVar14 = (lysp_ext_instance *)((long)plVar14 + (ulong)bVar21 * -0x10 + 8);
            }
          }
        }
        uVar9 = uVar9 + 1;
        if ((pctx->ext_inst).count <= uVar9) {
          return LY_SUCCESS;
        }
      } while( true );
    }
  }
  return LY_SUCCESS;
LAB_0015a5b0:
  uVar9 = local_70;
  plVar16 = local_78;
  if (LVar1 != LY_SUCCESS) {
    return LVar1;
  }
LAB_0015a5c4:
  local_68 = (void *)((long)local_68 + 1);
  goto LAB_0015a2e4;
}

Assistant:

static LY_ERR
lysp_resolve_ext_instance_records(struct lysp_ctx *pctx)
{
    LY_ERR r;
    struct lysf_ctx fctx = {.ctx = PARSER_CTX(pctx)};
    struct lysp_ext_instance *exts, *ext;
    const struct lys_module *mod;
    uint32_t i;
    LY_ARRAY_COUNT_TYPE u;
    char *path = NULL;

    /* first finish parsing all extension instances ... */
    for (i = 0; i < pctx->ext_inst.count; ++i) {
        exts = pctx->ext_inst.objs[i];
        LY_ARRAY_FOR(exts, u) {
            ext = &exts[u];

            /* find the extension definition */
            LY_CHECK_RET(lysp_ext_find_definition(PARSER_CTX(pctx), ext, &mod, &ext->def));

            /* resolve the argument, if needed */
            LY_CHECK_RET(lysp_ext_instance_resolve_argument(PARSER_CTX(pctx), ext));

            /* find the extension record, if any */
            ext->record = lyplg_ext_record_find(mod->ctx, mod->name, mod->revision, ext->def->name);
        }
    }

    /* ... then call the parse callback */
    for (i = 0; i < pctx->ext_inst.count; ++i) {
        exts = pctx->ext_inst.objs[i];
        u = 0;
        while (u < LY_ARRAY_COUNT(exts)) {
            ext = &exts[u];
            if (!ext->record || !ext->record->plugin.parse) {
                goto next_iter;
            }

            /* set up log path */
            if ((r = lysp_resolve_ext_instance_log_path(pctx, ext, &path))) {
                return r;
            }
            ly_log_location(NULL, NULL, path, NULL);

            /* parse */
            r = ext->record->plugin.parse(pctx, ext);

            ly_log_location_revert(0, 0, 1, 0);
            free(path);

            if (r == LY_ENOT) {
                /* instance should be ignored, remove it */
                lysp_ext_instance_free(&fctx, ext);
                LY_ARRAY_DECREMENT(exts);
                if (u < LY_ARRAY_COUNT(exts)) {
                    /* replace by the last item */
                    *ext = exts[LY_ARRAY_COUNT(exts)];
                } /* else if there are no more items, leave the empty array, we are not able to free it */
                continue;
            } else if (r) {
                /* error */
                return r;
            }

next_iter:
            ++u;
        }
    }

    return LY_SUCCESS;
}